

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

QVariant * __thiscall
QListWidgetItem::data(QVariant *__return_storage_ptr__,QListWidgetItem *this,int role)

{
  QWidgetItemData *pQVar1;
  ulong uVar2;
  int iVar3;
  QWidgetItemData *pQVar4;
  QWidgetItemData *pQVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar3 = 0;
  if (role != 2) {
    iVar3 = role;
  }
  uVar2 = (this->d->values).d.size;
  bVar7 = uVar2 != 0;
  if (bVar7) {
    pQVar5 = (this->d->values).d.ptr;
    if (pQVar5->role != iVar3) {
      uVar6 = 0;
      pQVar4 = pQVar5;
      do {
        if (uVar2 - 1 == uVar6) goto LAB_0058708e;
        pQVar5 = pQVar4 + 1;
        uVar6 = uVar6 + 1;
        pQVar1 = pQVar4 + 1;
        pQVar4 = pQVar5;
      } while (pQVar1->role != iVar3);
      bVar7 = uVar6 < uVar2;
    }
    ::QVariant::QVariant(__return_storage_ptr__,&pQVar5->value);
    if (bVar7) {
      return __return_storage_ptr__;
    }
  }
LAB_0058708e:
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QListWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i)
        if (d->values.at(i).role == role)
            return d->values.at(i).value;
    return QVariant();
}